

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

Polynomial * __thiscall
PolynomialParser::value(Polynomial *__return_storage_ptr__,PolynomialParser *this)

{
  int end;
  string *excep;
  PolynomialParser *this_local;
  
  end = std::__cxx11::string::size();
  parsePoly(this,0,end);
  Polynomial::Polynomial(__return_storage_ptr__,&this->mResult);
  return __return_storage_ptr__;
}

Assistant:

Polynomial value()
  {
    try {
      parsePoly(0, mString.size());
    }
    catch (const std::string& excep) {
      std::cout << "exception: " << excep << std::endl;
    }
      
    return mResult;
  }